

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ElementDocument * __thiscall Rml::Context::CreateDocument(Context *this,String *instancer_name)

{
  bool bVar1;
  undefined8 uVar2;
  pointer pEVar3;
  type var;
  char *pcVar4;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_68;
  ElementDocument *local_60;
  ElementDocument *document;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_48;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_28;
  ElementPtr element;
  String *instancer_name_local;
  Context *this_local;
  
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
       (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)instancer_name;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_48);
  Factory::InstanceElement
            ((Factory *)&local_28,(Element *)0x0,instancer_name,&this->documents_base_tag,&local_48)
  ;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_48);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar1) {
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_28);
    local_60 = rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>(pEVar3);
    if (local_60 == (ElementDocument *)0x0) {
      uVar2 = ::std::__cxx11::string::c_str();
      var = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*(&local_28);
      pcVar4 = rmlui_type_name<Rml::Element>(var);
      Log::Message(LT_ERROR,
                   "Failed to instance document on instancer_name \'%s\', Found type \'%s\', was expecting derivative of ElementDocument."
                   ,uVar2,pcVar4);
      this_local = (Context *)0x0;
    }
    else {
      local_60->context = this;
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_68,&local_28)
      ;
      Element::AppendChild(pEVar3,&local_68,true);
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_68);
      PluginRegistry::NotifyDocumentLoad(local_60);
      this_local = (Context *)local_60;
    }
  }
  else {
    uVar2 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,
                 "Failed to instance document on instancer_name \'%s\', instancer returned nullptr."
                 ,uVar2);
    this_local = (Context *)0x0;
  }
  document._0_4_ = 1;
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_28);
  return (ElementDocument *)this_local;
}

Assistant:

ElementDocument* Context::CreateDocument(const String& instancer_name)
{
	ElementPtr element = Factory::InstanceElement(nullptr, instancer_name, documents_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document on instancer_name '%s', instancer returned nullptr.", instancer_name.c_str());
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR,
			"Failed to instance document on instancer_name '%s', Found type '%s', was expecting derivative of ElementDocument.",
			instancer_name.c_str(), rmlui_type_name(*element));
		return nullptr;
	}

	document->context = this;
	root->AppendChild(std::move(element));

	PluginRegistry::NotifyDocumentLoad(document);

	return document;
}